

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearCase.cpp
# Opt level: O0

void __thiscall
deqp::egl::SingleThreadColorClearCase::executeForContexts
          (SingleThreadColorClearCase *this,EGLDisplay display,EGLSurface surface,Config *config,
          vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_> *contexts)

{
  EGLint EVar1;
  EglTestContext *this_00;
  bool bVar2;
  int width_00;
  int height_00;
  deUint32 dVar3;
  ApiType apiType;
  TestLog *log_00;
  char *str;
  const_reference pvVar4;
  pointer ppVar5;
  PixelFormat PVar6;
  RGBA local_1b88;
  RGBA local_1b84;
  RGBA local_1b80;
  undefined1 local_1b79;
  void *pvStack_1b78;
  bool imagesOk;
  EGLContext context_2;
  __normal_iterator<const_std::pair<int,_void_*>_*,_std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>_>
  _Stack_1b68;
  EGLint api_2;
  undefined1 local_1b60 [8];
  ClearOp clear_1;
  int clearNdx;
  EGLContext context_1;
  const_iterator cStack_1b38;
  EGLint api_1;
  __normal_iterator<const_std::pair<int,_void_*>_*,_std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>_>
  local_1b30;
  const_iterator ctxIter;
  RGBA local_1b20;
  int iterNdx;
  ClearOp clear;
  EGLContext context;
  EGLint api;
  ApiFunctions funcs;
  int numIters;
  int ctxClears;
  vector<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_> clears;
  Random rnd;
  PixelFormat pixelFmt;
  undefined1 local_80 [8];
  Surface frame;
  Surface refFrame;
  TestLog *log;
  int height;
  int width;
  IVec2 surfaceSize;
  Library *egl;
  vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_> *contexts_local;
  Config *config_local;
  EGLSurface surface_local;
  EGLDisplay display_local;
  SingleThreadColorClearCase *this_local;
  
  surfaceSize.m_data =
       (int  [2])
       EglTestContext::getLibrary
                 ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                  super_TestCase.m_eglTestCtx);
  eglu::getSurfaceSize((eglu *)&height,(Library *)surfaceSize.m_data,display,surface);
  width_00 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&height);
  height_00 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&height);
  log_00 = tcu::TestContext::getLog
                     ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                      super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  tcu::Surface::Surface((Surface *)&frame.m_pixels.m_cap,width_00,height_00);
  tcu::Surface::Surface((Surface *)local_80,width_00,height_00);
  PVar6 = getPixelFormat((Library *)surfaceSize.m_data,display,config->config);
  rnd.m_rnd._8_8_ = PVar6._0_8_;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  de::Random::Random((Random *)
                     ((long)&clears.
                             super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),dVar3);
  std::vector<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>::vector
            ((vector<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_> *)&numIters);
  funcs.gl.waitSync._4_4_ = 2;
  funcs.gl.waitSync._0_4_ = 3;
  ApiFunctions::ApiFunctions((ApiFunctions *)&api);
  this_00 = (this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
            super_TestCase.m_eglTestCtx;
  apiType = glu::ApiType::es(2,0);
  EglTestContext::initGLFunctions(this_00,(Functions *)&api,apiType);
  pvVar4 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::operator[]
                     (contexts,0);
  EVar1 = pvVar4->first;
  pvVar4 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::operator[]
                     (contexts,0);
  clear._12_8_ = pvVar4->second;
  local_1b20 = tcu::RGBA::black();
  ClearOp::ClearOp((ClearOp *)&iterNdx,0,0,width_00,height_00,&local_1b20);
  (**(code **)(*(long *)surfaceSize.m_data + 0x138))
            (surfaceSize.m_data,display,surface,surface,clear._12_8_);
  dVar3 = (**(code **)(*(long *)surfaceSize.m_data + 0xf8))();
  eglu::checkError(dVar3,"eglMakeCurrent",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglColorClearCase.cpp"
                   ,0xc6);
  renderClear(EVar1,(ApiFunctions *)&api,(ClearOp *)&iterNdx);
  finish(EVar1,(ApiFunctions *)&api);
  std::vector<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>::push_back
            ((vector<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_> *)&numIters,
             (value_type *)&iterNdx);
  for (ctxIter._M_current._4_4_ = 0; ctxIter._M_current._4_4_ < 3;
      ctxIter._M_current._4_4_ = ctxIter._M_current._4_4_ + 1) {
    local_1b30._M_current =
         (pair<int,_void_*> *)
         std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::begin
                   (contexts);
    while( true ) {
      cStack_1b38 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::
                    end(contexts);
      bVar2 = __gnu_cxx::operator!=(&local_1b30,&stack0xffffffffffffe4c8);
      if (!bVar2) break;
      ppVar5 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_void_*>_*,_std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>_>
               ::operator->(&local_1b30);
      EVar1 = ppVar5->first;
      ppVar5 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_void_*>_*,_std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>_>
               ::operator->(&local_1b30);
      unique0x00012000 = ppVar5->second;
      (**(code **)(*(long *)surfaceSize.m_data + 0x138))
                (surfaceSize.m_data,display,surface,surface,unique0x00012000);
      dVar3 = (**(code **)(*(long *)surfaceSize.m_data + 0xf8))();
      eglu::checkError(dVar3,"eglMakeCurrent",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglColorClearCase.cpp"
                       ,0xd6);
      for (clear_1.height = 0; clear_1.height < 2; clear_1.height = clear_1.height + 1) {
        computeRandomClear((ClearOp *)local_1b60,
                           (Random *)
                           ((long)&clears.
                                   super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),width_00,
                           height_00);
        renderClear(EVar1,(ApiFunctions *)&api,(ClearOp *)local_1b60);
        std::vector<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>::push_back
                  ((vector<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_> *)&numIters,
                   (value_type *)local_1b60);
      }
      finish(EVar1,(ApiFunctions *)&api);
      _Stack_1b68 = __gnu_cxx::
                    __normal_iterator<const_std::pair<int,_void_*>_*,_std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>_>
                    ::operator++(&local_1b30,0);
    }
  }
  pvVar4 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::operator[]
                     (contexts,0);
  context_2._4_4_ = pvVar4->first;
  pvVar4 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::operator[]
                     (contexts,0);
  pvStack_1b78 = pvVar4->second;
  (**(code **)(*(long *)surfaceSize.m_data + 0x138))
            (surfaceSize.m_data,display,surface,surface,pvStack_1b78);
  dVar3 = (**(code **)(*(long *)surfaceSize.m_data + 0xf8))();
  eglu::checkError(dVar3,"eglMakeCurrent",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglColorClearCase.cpp"
                   ,0xea);
  readPixels(context_2._4_4_,(ApiFunctions *)&api,(Surface *)local_80);
  (**(code **)(*(long *)surfaceSize.m_data + 0x138))(surfaceSize.m_data,display,0,0);
  dVar3 = (**(code **)(*(long *)surfaceSize.m_data + 0xf8))();
  eglu::checkError(dVar3,"eglMakeCurrent",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglColorClearCase.cpp"
                   ,0xf0);
  renderReference((Surface *)&frame.m_pixels.m_cap,
                  (vector<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_> *)&numIters,
                  (PixelFormat *)&rnd.m_rnd.z);
  tcu::RGBA::RGBA(&local_1b84,1,1,1,1);
  local_1b88 = tcu::PixelFormat::getColorThreshold((PixelFormat *)&rnd.m_rnd.z);
  local_1b80 = tcu::operator+(&local_1b84,&local_1b88);
  local_1b79 = tcu::pixelThresholdCompare
                         (log_00,"ComparisonResult","Image comparison result",
                          (Surface *)&frame.m_pixels.m_cap,(Surface *)local_80,&local_1b80,
                          COMPARE_LOG_RESULT);
  if (!(bool)local_1b79) {
    tcu::TestContext::setTestResult
              ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  std::vector<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>::~vector
            ((vector<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_> *)&numIters);
  de::Random::~Random((Random *)
                      ((long)&clears.
                              super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  tcu::Surface::~Surface((Surface *)local_80);
  tcu::Surface::~Surface((Surface *)&frame.m_pixels.m_cap);
  return;
}

Assistant:

void SingleThreadColorClearCase::executeForContexts (EGLDisplay display, EGLSurface surface, const Config& config, const std::vector<std::pair<EGLint, EGLContext> >& contexts)
{
	const Library&		egl			= m_eglTestCtx.getLibrary();

	const tcu::IVec2	surfaceSize	= eglu::getSurfaceSize(egl, display, surface);
	const int			width		= surfaceSize.x();
	const int			height		= surfaceSize.y();

	TestLog&			log			= m_testCtx.getLog();

	tcu::Surface		refFrame	(width, height);
	tcu::Surface		frame		(width, height);
	tcu::PixelFormat	pixelFmt	= getPixelFormat(egl, display, config.config);

	de::Random			rnd			(deStringHash(getName()));
	vector<ClearOp>		clears;
	const int			ctxClears	= 2;
	const int			numIters	= 3;

	ApiFunctions		funcs;

	m_eglTestCtx.initGLFunctions(&funcs.gl, glu::ApiType::es(2,0));

	// Clear to black using first context.
	{
		EGLint		api			= contexts[0].first;
		EGLContext	context		= contexts[0].second;
		ClearOp		clear		(0, 0, width, height, RGBA::black());

		egl.makeCurrent(display, surface, surface, context);
		EGLU_CHECK_MSG(egl, "eglMakeCurrent");

		renderClear(api, funcs, clear);
		finish(api, funcs);
		clears.push_back(clear);
	}

	// Render.
	for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
	{
		for (vector<std::pair<EGLint, EGLContext> >::const_iterator ctxIter = contexts.begin(); ctxIter != contexts.end(); ctxIter++)
		{
			EGLint		api			= ctxIter->first;
			EGLContext	context		= ctxIter->second;

			egl.makeCurrent(display, surface, surface, context);
			EGLU_CHECK_MSG(egl, "eglMakeCurrent");

			for (int clearNdx = 0; clearNdx < ctxClears; clearNdx++)
			{
				ClearOp clear = computeRandomClear(rnd, width, height);

				renderClear(api, funcs, clear);
				clears.push_back(clear);
			}

			finish(api, funcs);
		}
	}

	// Read pixels using first context. \todo [pyry] Randomize?
	{
		EGLint		api		= contexts[0].first;
		EGLContext	context	= contexts[0].second;

		egl.makeCurrent(display, surface, surface, context);
		EGLU_CHECK_MSG(egl, "eglMakeCurrent");

		readPixels(api, funcs, frame);
	}

	egl.makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);
	EGLU_CHECK_MSG(egl, "eglMakeCurrent");

	// Render reference.
	renderReference(refFrame, clears, pixelFmt);

	// Compare images
	{
		bool imagesOk = tcu::pixelThresholdCompare(log, "ComparisonResult", "Image comparison result", refFrame, frame, RGBA(1,1,1,1) + pixelFmt.getColorThreshold(), tcu::COMPARE_LOG_RESULT);

		if (!imagesOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}
}